

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O3

int __thiscall CCollision::GetTile(CCollision *this,int x,int y)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = x + 0x1f;
  if (-1 < x) {
    iVar2 = x;
  }
  iVar4 = this->m_Width + -1;
  iVar3 = iVar2 >> 5;
  if (iVar4 <= iVar2 >> 5) {
    iVar3 = iVar4;
  }
  if (x < -0x1f) {
    iVar3 = 0;
  }
  iVar2 = y + 0x1f;
  if (-1 < y) {
    iVar2 = y;
  }
  iVar4 = this->m_Height + -1;
  if (iVar2 >> 5 < iVar4) {
    iVar4 = iVar2 >> 5;
  }
  if (y < -0x1f) {
    iVar4 = 0;
  }
  bVar1 = this->m_pTiles[iVar4 * this->m_Width + iVar3].m_Index;
  if (0x80 < bVar1) {
    bVar1 = 0;
  }
  return (int)bVar1;
}

Assistant:

int CCollision::GetTile(int x, int y) const
{
	int Nx = clamp(x/32, 0, m_Width-1);
	int Ny = clamp(y/32, 0, m_Height-1);

	return m_pTiles[Ny*m_Width+Nx].m_Index > 128 ? 0 : m_pTiles[Ny*m_Width+Nx].m_Index;
}